

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__pnm_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  stbi__uint32 c_00;
  stbi_uc sVar1;
  int iVar2;
  stbi__uint32 sVar3;
  int iVar4;
  undefined8 in_RAX;
  stbi_uc *psVar5;
  char *pcVar6;
  uchar *puVar7;
  long in_FS_OFFSET;
  bool bVar8;
  char c;
  undefined8 uStack_38;
  
  psVar5 = s->img_buffer_original;
  s->img_buffer = psVar5;
  s->img_buffer_end = s->img_buffer_original_end;
  uStack_38 = in_RAX;
  if (psVar5 < s->img_buffer_original_end) {
LAB_00124f2e:
    s->img_buffer = psVar5 + 1;
    bVar8 = *psVar5 != 'P';
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar5 = s->buffer_start;
      iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
      s->callback_already_read =
           s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
      if (iVar2 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar5;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar5;
        s->img_buffer_end = psVar5 + iVar2;
      }
      psVar5 = s->img_buffer;
      goto LAB_00124f2e;
    }
    bVar8 = true;
  }
  psVar5 = s->img_buffer;
  if (psVar5 < s->img_buffer_end) {
LAB_00124fba:
    s->img_buffer = psVar5 + 1;
    sVar1 = *psVar5;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar5 = s->buffer_start;
      iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
      s->callback_already_read =
           s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
      if (iVar2 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar5;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar5;
        s->img_buffer_end = psVar5 + iVar2;
      }
      psVar5 = s->img_buffer;
      goto LAB_00124fba;
    }
    sVar1 = '\0';
  }
  if (!(bool)(~bVar8 & 0xfd < (byte)(sVar1 - 0x37))) {
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    return (void *)0x0;
  }
  s->img_n = (uint)(sVar1 == '6') * 2 + 1;
  psVar5 = s->img_buffer;
  if (psVar5 < s->img_buffer_end) {
LAB_00125076:
    s->img_buffer = psVar5 + 1;
    sVar1 = *psVar5;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar5 = s->buffer_start;
      iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
      s->callback_already_read =
           s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
      if (iVar2 == 0) {
        s->read_from_callbacks = 0;
        s->img_buffer = psVar5;
        s->img_buffer_end = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
      }
      else {
        s->img_buffer = psVar5;
        s->img_buffer_end = psVar5 + iVar2;
      }
      psVar5 = s->img_buffer;
      goto LAB_00125076;
    }
    sVar1 = '\0';
  }
  uStack_38 = CONCAT17(sVar1,(undefined7)uStack_38);
  stbi__pnm_skip_whitespace(s,(char *)((long)&uStack_38 + 7));
  sVar3 = stbi__pnm_getinteger(s,(char *)((long)&uStack_38 + 7));
  if (s != (stbi__context *)0x0) {
    s->img_x = sVar3;
  }
  pcVar6 = (char *)((long)&uStack_38 + 7);
  stbi__pnm_skip_whitespace(s,pcVar6);
  sVar3 = stbi__pnm_getinteger(s,pcVar6);
  s->img_y = sVar3;
  stbi__pnm_skip_whitespace(s,pcVar6);
  iVar2 = stbi__pnm_getinteger(s,pcVar6);
  if (iVar2 < 0x100) {
    if ((s->img_y < 0x1000001) && (s->img_x < 0x1000001)) {
      *x = s->img_x;
      *y = s->img_y;
      if (comp != (int *)0x0) {
        *comp = s->img_n;
      }
      iVar2 = s->img_n;
      sVar3 = s->img_x;
      c_00 = s->img_y;
      iVar4 = stbi__mad3sizes_valid(iVar2,sVar3,c_00,0);
      if (iVar4 != 0) {
        puVar7 = (uchar *)stbi__malloc_mad3(iVar2,sVar3,c_00,0);
        if (puVar7 != (uchar *)0x0) {
          stbi__getn(s,puVar7,sVar3 * iVar2 * c_00);
          if (s->img_n != 4) {
            puVar7 = stbi__convert_format(puVar7,s->img_n,s->img_x,s->img_y,req_comp);
            return puVar7;
          }
          return puVar7;
        }
        pcVar6 = "outofmem";
        goto LAB_00125192;
      }
    }
    pcVar6 = "too large";
  }
  else {
    pcVar6 = "max value > 255";
  }
LAB_00125192:
  *(char **)(in_FS_OFFSET + -8) = pcVar6;
  return (void *)0x0;
}

Assistant:

static void *stbi__pnm_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   stbi_uc *out;
   STBI_NOTUSED(ri);

   if (!stbi__pnm_info(s, (int *)&s->img_x, (int *)&s->img_y, (int *)&s->img_n))
      return 0;

   if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   *x = s->img_x;
   *y = s->img_y;
   if (comp) *comp = s->img_n;

   if (!stbi__mad3sizes_valid(s->img_n, s->img_x, s->img_y, 0))
      return stbi__errpuc("too large", "PNM too large");

   out = (stbi_uc *) stbi__malloc_mad3(s->img_n, s->img_x, s->img_y, 0);
   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   stbi__getn(s, out, s->img_n * s->img_x * s->img_y);

   if (req_comp && req_comp != s->img_n) {
      out = stbi__convert_format(out, s->img_n, req_comp, s->img_x, s->img_y);
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }
   return out;
}